

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGClient.cpp
# Opt level: O2

void __thiscall
ViconCGStreamClientSDK::VCGClient::ReceiveMulticastData
          (VCGClient *this,string *i_MulticastIPAddress,string *i_LocalIPAddress,
          unsigned_short i_Port)

{
  __shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *this_00;
  __shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<VViconCGStreamClient> pClient;
  scoped_lock Lock;
  __shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2> local_90;
  unique_lock<boost::recursive_mutex> local_80;
  string local_70;
  string local_50;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&local_80,&this->m_ClientMutex);
  p_Var1 = &((this->m_pClients).
             super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((this->m_pClients).
                  super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_90,p_Var2);
    this_00 = local_90._M_ptr;
    std::__cxx11::string::string((string *)&local_50,(string *)i_MulticastIPAddress);
    std::__cxx11::string::string((string *)&local_70,(string *)i_LocalIPAddress);
    VViconCGStreamClient::ReceiveMulticastData(this_00,&local_50,&local_70,i_Port);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  }
  this->m_bMulticastReceiving =
       (this->m_pClients).
       super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->m_pClients).
       super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&local_80);
  return;
}

Assistant:

void VCGClient::ReceiveMulticastData( std::string i_MulticastIPAddress, std::string i_LocalIPAddress, unsigned short i_Port )
{
  boost::recursive_mutex::scoped_lock Lock( m_ClientMutex );

  for (auto pClient : m_pClients)
  {
    pClient->ReceiveMulticastData(i_MulticastIPAddress, i_LocalIPAddress, i_Port);
  }

  m_bMulticastReceiving = !m_pClients.empty();
}